

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.c
# Opt level: O0

void lace_init_worker(uint worker)

{
  worker_data *pwVar1;
  int iVar2;
  int iVar3;
  worker_data *pwVar4;
  WorkerP *pWVar5;
  long in_FS_OFFSET;
  WorkerP *w;
  Worker *wt;
  uint worker_local;
  
  pwVar4 = (worker_data *)aligned_alloc(0x40);
  workers_memory[worker] = pwVar4;
  if (workers_memory[worker] == (worker_data *)0x0) {
    fprintf(_stderr,"Lace error: Unable to allocate memory for the Lace worker!\n");
    exit(1);
  }
  memset(workers_memory[worker],0,workers_memory_size);
  pwVar4 = workers_memory[worker];
  workers[worker] = &pwVar4->worker_public;
  pwVar1 = workers_memory[worker];
  pWVar5 = &pwVar1->worker_private;
  workers_p[worker] = pWVar5;
  pWVar5->dq = (Task *)(workers_memory[worker] + 1);
  *(WorkerP **)(in_FS_OFFSET + -8) = pWVar5;
  (pwVar4->worker_public).dq = pWVar5->dq;
  LOCK();
  (pwVar4->worker_public).ts.v = 0;
  UNLOCK();
  (pwVar4->worker_public).allstolen = '\0';
  (pwVar4->worker_public).movesplit = '\0';
  (pwVar1->worker_private)._public = &pwVar4->worker_public;
  (pwVar1->worker_private).end = pWVar5->dq + default_dqsize;
  (pwVar1->worker_private).split = pWVar5->dq;
  (pwVar1->worker_private).allstolen = '\0';
  (pwVar1->worker_private).worker = (uint16_t)worker;
  (pwVar1->worker_private).pu = -1;
  iVar2 = rand();
  iVar3 = rand();
  (pwVar1->worker_private).rng = (long)iVar2 << 0x20 | (long)iVar3;
  return;
}

Assistant:

void
lace_init_worker(unsigned int worker)
{
    // Allocate our memory
#if LACE_USE_MMAP
    workers_memory[worker] = mmap(NULL, workers_memory_size, PROT_READ|PROT_WRITE, MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
    if (workers_memory[worker] == MAP_FAILED) {
        fprintf(stderr, "Lace error: Unable to allocate mmapped memory for the Lace worker!\n");
        exit(1);
    }
#else
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    workers_memory[worker] = _aligned_malloc(workers_memory_size, LINE_SIZE);
#elif defined(__MINGW32__)
    workers_memory[worker] = __mingw_aligned_malloc(workers_memory_size, LINE_SIZE);
#else
    workers_memory[worker] = aligned_alloc(LINE_SIZE, workers_memory_size);
#endif
    if (workers_memory[worker] == 0) {
        fprintf(stderr, "Lace error: Unable to allocate memory for the Lace worker!\n");
        exit(1);
    }
    memset(workers_memory[worker], 0, workers_memory_size);
#endif

    // Set pointers
    Worker *wt = workers[worker] = &workers_memory[worker]->worker_public;
    WorkerP *w = workers_p[worker] = &workers_memory[worker]->worker_private;
    w->dq = workers_memory[worker]->deque;
#ifdef __linux__
    current_worker = w;
#else
    pthread_setspecific(current_worker_key, w);
#endif

    // Initialize public worker data
    wt->dq = w->dq;
    wt->ts.v = 0;
    wt->allstolen = 0;
    wt->movesplit = 0;

    // Initialize private worker data
    w->_public = wt;
    w->end = w->dq + default_dqsize;
    w->split = w->dq;
    w->allstolen = 0;
    w->worker = worker;
#if LACE_USE_HWLOC
    w->pu = worker % n_cores;
#else
    w->pu = -1;
#endif
    w->rng = (((uint64_t)rand())<<32 | rand());

#if LACE_COUNT_EVENTS
    // Initialize counters
    { int k; for (k=0; k<CTR_MAX; k++) w->ctr[k] = 0; }
#endif

#if LACE_PIE_TIMES
    w->time = gethrtime();
    w->level = 0;
#endif
}